

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O0

uint64_t helper_cvd(int32_t reg)

{
  int local_24;
  long lStack_20;
  int shift;
  int64_t bin;
  uint64_t dec;
  int32_t reg_local;
  
  bin = 0xc;
  lStack_20 = (long)reg;
  if (lStack_20 < 0) {
    lStack_20 = -lStack_20;
    bin = 0xd;
  }
  for (local_24 = 4; local_24 < 0x40 && lStack_20 != 0; local_24 = local_24 + 4) {
    bin = lStack_20 % 10 << ((byte)local_24 & 0x3f) | bin;
    lStack_20 = lStack_20 / 10;
  }
  return bin;
}

Assistant:

uint64_t HELPER(cvd)(int32_t reg)
{
    /* positive 0 */
    uint64_t dec = 0x0c;
    int64_t bin = reg;
    int shift;

    if (bin < 0) {
        bin = -bin;
        dec = 0x0d;
    }

    for (shift = 4; (shift < 64) && bin; shift += 4) {
        dec |= (bin % 10) << shift;
        bin /= 10;
    }

    return dec;
}